

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_config_find_param.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  value *this;
  double *pdVar2;
  int iVar3;
  value v;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  string path;
  ifstream in;
  value vStack_298;
  allocator local_290 [56];
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  iVar3 = 1;
  if (argc == 3) {
    std::ifstream::ifstream(local_238,argv[2],_S_in);
    iVar3 = 1;
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      cppcms::json::value::copyable::copyable(&vStack_298.d);
      bVar1 = cppcms::json::value::load(&vStack_298,(istream *)local_238,true,(int *)0x0);
      iVar3 = 1;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_258,argv[1],local_290);
        this = cppcms::json::value::at(&vStack_298,&local_258);
        pdVar2 = cppcms::json::value::number(this);
        std::ostream::_M_insert<double>(*pdVar2);
        iVar3 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
          iVar3 = 0;
        }
      }
      cppcms::json::value::copyable::~copyable(&vStack_298.d);
    }
    std::ifstream::~ifstream(local_238);
  }
  return iVar3;
}

Assistant:

int main(int argc,char **argv)
{
	using namespace cppcms;
	if(argc!=3)
		return 1;
	std::ifstream in(argv[2]);
	if(!in)
		return 1;
	
	json::value v;
	if(!v.load(in,true))
		return 1;
	std::string path=argv[1];
	try {
		std::cout<<v.get<double>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<<v.get<std::string>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<< (v.get<bool>(path) ? "true" : "false" );
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::vector<std::string> vs=v.get<std::vector<std::string> >(path);
		std::string sep="";
		for(unsigned i=0;i<vs.size();i++) {
			std::cout<<sep<<vs[i];
			sep=" ";
		}
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	return 1;
}